

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

OptionsType * __thiscall
google::protobuf::DescriptorBuilder::
AllocateOptionsImpl<google::protobuf::Descriptor::ExtensionRange>
          (DescriptorBuilder *this,string_view name_scope,string_view element_name,Proto *proto,
          Span<const_int> options_path,string_view option_name,FlatAllocator *alloc)

{
  DescriptorPool *this_00;
  string_view el;
  bool bVar1;
  int iVar2;
  int iVar3;
  Symbol SVar4;
  const_reference pUVar5;
  FieldDescriptor *pFVar6;
  string *psVar7;
  undefined8 extraout_RAX;
  uint uVar8;
  PointerT<google::protobuf::ExtensionRangeOptions> unaff_RBP;
  byte bVar9;
  long lVar10;
  Symbol extendee;
  long unaff_R13;
  OptionsType *opt;
  SooRep *this_01;
  ExtensionRangeOptions *p;
  pointer_____offset_0x10___ *msg;
  string_view from;
  string_view ns;
  string_view element_name_00;
  FieldDescriptor *local_130;
  FileOptions *local_128;
  Tables *local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [3];
  undefined1 local_b0 [32];
  FieldDescriptor *local_90;
  _Alloc_hider local_88;
  AlphaNum local_60;
  FieldDescriptor *to;
  
  pFVar6 = (FieldDescriptor *)element_name._M_len;
  ns._M_len = (pointer)name_scope._M_len;
  uVar8 = (proto->field_0)._impl_._has_bits_.has_bits_[0];
  msg = (pointer_____offset_0x10___ *)(proto->field_0)._impl_.options_;
  bVar9 = (ExtensionRangeOptions *)msg == (ExtensionRangeOptions *)0x0 & (byte)uVar8;
  lVar10 = CONCAT71(name_scope._M_len._1_7_,bVar9);
  if (bVar9 == 1) {
    internal::protobuf_assumption_failed
              ("!value || _impl_.options_ != nullptr",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.pb.h"
               ,0x3296);
  }
  if ((uVar8 & 1) == 0) {
    return (OptionsType *)&_ExtensionRangeOptions_default_instance_;
  }
  if ((ExtensionRangeOptions *)msg == (ExtensionRangeOptions *)0x0) {
    msg = &_ExtensionRangeOptions_default_instance_;
  }
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
    AllocateOptionsImpl<google::protobuf::Descriptor::ExtensionRange>
              ((DescriptorBuilder *)local_118);
    to = pFVar6;
LAB_00222de2:
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)(int)to,lVar10,"used <= total_.template Get<TypeToUse>()");
  }
  else {
    unaff_RBP = (alloc->
                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ).pointers_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
    iVar2 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).used_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
    unaff_R13 = (long)iVar2;
    uVar8 = iVar2 + 1;
    to = (FieldDescriptor *)(ulong)uVar8;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value = uVar8;
    iVar2 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).total_.payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
    lVar10 = (long)iVar2;
    local_130 = pFVar6;
    local_128 = (FileOptions *)element_name._M_str;
    local_120 = (Tables *)name_scope._M_str;
    if (iVar2 < (int)uVar8) goto LAB_00222de2;
    psVar7 = (string *)0x0;
  }
  if (psVar7 != (string *)0x0) {
    AllocateOptionsImpl<google::protobuf::Descriptor::ExtensionRange>();
    anon_unknown_23::OptionsToInterpret::~OptionsToInterpret((OptionsToInterpret *)local_118);
    _Unwind_Resume(extraout_RAX);
  }
  bVar1 = ExtensionRangeOptions::IsInitializedImpl((MessageLite *)msg);
  if (!bVar1) {
    local_118._8_8_ = local_120;
    local_60.piece_._M_len = 1;
    local_60.piece_._M_str = ".";
    local_90 = local_130;
    local_88._M_p = (pointer)local_128;
    local_118._0_8_ = ns._M_len;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_b0,(AlphaNum *)local_118,&local_60);
    element_name_00._M_str = (char *)local_b0._0_8_;
    element_name_00._M_len = local_b0._8_8_;
    AddError(this,element_name_00,(Message *)msg,OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    if ((undefined1 *)local_b0._0_8_ == local_b0 + 0x10) {
      return (OptionsType *)&_ExtensionRangeOptions_default_instance_;
    }
    operator_delete((void *)local_b0._0_8_,
                    (ulong)((long)&(((string *)local_b0._16_8_)->_M_dataplus)._M_p + 1));
    return (OptionsType *)&_ExtensionRangeOptions_default_instance_;
  }
  opt = unaff_RBP + unaff_R13;
  MessageLite::SerializeAsString_abi_cxx11_((string *)local_118,(MessageLite *)msg);
  from._M_str = (char *)opt;
  from._M_len = local_118._0_8_;
  bVar1 = internal::ParseNoReflection((internal *)local_118._8_8_,from,(MessageLite *)to);
  if ((FileDescriptor *)local_118._0_8_ != (FileDescriptor *)local_108) {
    operator_delete((void *)local_118._0_8_,local_108._0_8_ + 1);
  }
  if (bVar1) {
    if (0 < *(int *)((long)&opt->field_0 + 0x40)) {
      el._M_str = (char *)local_128;
      el._M_len = (size_t)local_130;
      ns._M_str = (char *)local_120;
      anon_unknown_23::OptionsToInterpret::OptionsToInterpret
                ((OptionsToInterpret *)local_118,ns,el,options_path,(Message *)msg,
                 &opt->super_Message);
      std::
      vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ::push_back(&this->options_to_interpret_,(OptionsToInterpret *)local_118);
      if ((pointer)local_e8[1]._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_e8[1]._0_8_,local_e8[2]._0_8_ - local_e8[1]._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._16_8_ != local_e8) {
        operator_delete((void *)local_108._16_8_,local_e8[0]._M_allocated_capacity + 1);
      }
      if ((FileDescriptor *)local_118._0_8_ != (FileDescriptor *)local_108) {
        operator_delete((void *)local_118._0_8_,local_108._0_8_ + 1);
      }
    }
    ns._M_len = (pointer)(((ExtensionRangeOptions *)msg)->super_Message).super_MessageLite.
                         _internal_metadata_.ptr_;
    if (((ulong)ns._M_len & 1) == 0) {
      this_01 = (SooRep *)&UnknownFieldSet::default_instance()::instance;
      goto LAB_00222c44;
    }
  }
  else {
    AllocateOptionsImpl<google::protobuf::Descriptor::ExtensionRange>
              ((DescriptorBuilder *)local_118);
  }
  this_01 = (SooRep *)(((ulong)ns._M_len & 0xfffffffffffffffe) + 8);
LAB_00222c44:
  iVar2 = internal::SooRep::size
                    (this_01,(undefined1  [16])
                             ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
  if (((iVar2 != 0) &&
      (SVar4 = DescriptorPool::Tables::FindSymbol(this->tables_,option_name),
      (SVar4.ptr_)->symbol_type_ == '\x01')) &&
     (iVar2 = internal::SooRep::size
                        (this_01,(undefined1  [16])
                                 ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0), 0 < iVar2)) {
    iVar2 = 0;
    do {
      if (this->pool_->mutex_ != (Mutex *)0x0) {
        absl::lts_20240722::Mutex::AssertHeld();
      }
      this_00 = this->pool_;
      extendee.ptr_ = &((Descriptor *)0x0)->super_SymbolBase;
      if ((SVar4.ptr_)->symbol_type_ == '\x01') {
        extendee = SVar4;
      }
      pUVar5 = RepeatedField<google::protobuf::UnknownField>::Get
                         ((RepeatedField<google::protobuf::UnknownField> *)this_01,iVar2);
      pFVar6 = DescriptorPool::InternalFindExtensionByNumberNoLock
                         (this_00,(Descriptor *)extendee.ptr_,pUVar5->number_);
      if (pFVar6 != (FieldDescriptor *)0x0) {
        local_118._0_8_ = pFVar6->file_;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::erase<google::protobuf::FileDescriptor_const*>
                  ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                    *)&this->unused_dependency_,
                   (key_arg<const_google::protobuf::FileDescriptor_*> *)local_118);
      }
      iVar2 = iVar2 + 1;
      iVar3 = internal::SooRep::size
                        (this_01,(undefined1  [16])
                                 ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
    } while (iVar2 < iVar3);
  }
  return opt;
}

Assistant:

const typename DescriptorT::OptionsType* DescriptorBuilder::AllocateOptionsImpl(
    absl::string_view name_scope, absl::string_view element_name,
    const typename DescriptorT::Proto& proto,
    absl::Span<const int> options_path, absl::string_view option_name,
    internal::FlatAllocator& alloc) {
  if (!proto.has_options()) {
    return &DescriptorT::OptionsType::default_instance();
  }
  const typename DescriptorT::OptionsType& orig_options = proto.options();

  auto* options = alloc.AllocateArray<typename DescriptorT::OptionsType>(1);

  if (!orig_options.IsInitialized()) {
    AddError(absl::StrCat(name_scope, ".", element_name), orig_options,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    return &DescriptorT::OptionsType::default_instance();
  }

  const bool parse_success =
      internal::ParseNoReflection(orig_options.SerializeAsString(), *options);
  ABSL_DCHECK(parse_success);

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(OptionsToInterpret(
        name_scope, element_name, options_path, &orig_options, options));
  }

  // If the custom option is in unknown fields, no need to interpret it.
  // Remove the dependency file from unused_dependency.
  const UnknownFieldSet& unknown_fields = orig_options.unknown_fields();
  if (!unknown_fields.empty()) {
    // Can not use options->GetDescriptor() which may case deadlock.
    Symbol msg_symbol = tables_->FindSymbol(option_name);
    if (msg_symbol.type() == Symbol::MESSAGE) {
      for (int i = 0; i < unknown_fields.field_count(); ++i) {
        assert_mutex_held(pool_);
        const FieldDescriptor* field =
            pool_->InternalFindExtensionByNumberNoLock(
                msg_symbol.descriptor(), unknown_fields.field(i).number());
        if (field) {
          unused_dependency_.erase(field->file());
        }
      }
    }
  }
  return options;
}